

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmMakefile::CreateSource
          (cmMakefile *this,string *sourceName,bool generated,cmSourceFileLocationKind kind)

{
  cmake *this_00;
  cmSourceFile *pcVar1;
  cmSourceFileLocation *pcVar2;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_01;
  mapped_type *ppcVar3;
  __single_object sf;
  string name;
  undefined1 local_59;
  _Head_base<0UL,_cmSourceFile_*,_false> local_58;
  cmSourceFileLocationKind local_4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  _Head_base<0UL,_cmSourceFile_*,_false> local_28;
  
  local_59 = generated;
  local_4c = kind;
  local_48._M_dataplus._M_p = (pointer)this;
  std::
  make_unique<cmSourceFile,cmMakefile*,std::__cxx11::string_const&,bool&,cmSourceFileLocationKind&>
            ((cmMakefile **)&local_58,&local_48,(bool *)sourceName,
             (cmSourceFileLocationKind *)&local_59);
  this_00 = this->GlobalGenerator->CMakeInstance;
  pcVar2 = cmSourceFile::GetLocation(local_58._M_head_impl);
  cmake::StripExtension(&local_48,this_00,&pcVar2->Name);
  this_01 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
            std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->SourceFileSearchIndex,&local_48);
  local_28._M_head_impl = local_58._M_head_impl;
  std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::emplace_back<cmSourceFile*>
            (this_01,&local_28._M_head_impl);
  if (local_4c == Known) {
    ppcVar3 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->KnownFileSearchIndex,sourceName);
    *ppcVar3 = local_58._M_head_impl;
  }
  std::
  vector<std::unique_ptr<cmSourceFile,std::default_delete<cmSourceFile>>,std::allocator<std::unique_ptr<cmSourceFile,std::default_delete<cmSourceFile>>>>
  ::emplace_back<std::unique_ptr<cmSourceFile,std::default_delete<cmSourceFile>>>
            ((vector<std::unique_ptr<cmSourceFile,std::default_delete<cmSourceFile>>,std::allocator<std::unique_ptr<cmSourceFile,std::default_delete<cmSourceFile>>>>
              *)&this->SourceFiles,
             (unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)&local_58);
  pcVar1 = (this->SourceFiles).
           super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
           super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
           super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
  std::__cxx11::string::~string((string *)&local_48);
  std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>::~unique_ptr
            ((unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_> *)&local_58);
  return pcVar1;
}

Assistant:

cmSourceFile* cmMakefile::CreateSource(const std::string& sourceName,
                                       bool generated,
                                       cmSourceFileLocationKind kind)
{
  auto sf = cm::make_unique<cmSourceFile>(this, sourceName, generated, kind);
  auto name =
    this->GetCMakeInstance()->StripExtension(sf->GetLocation().GetName());
#if defined(_WIN32) || defined(__APPLE__)
  name = cmSystemTools::LowerCase(name);
#endif
  this->SourceFileSearchIndex[name].push_back(sf.get());
  // for "Known" paths add direct lookup (used for faster lookup in GetSource)
  if (kind == cmSourceFileLocationKind::Known) {
    this->KnownFileSearchIndex[sourceName] = sf.get();
  }

  this->SourceFiles.push_back(std::move(sf));

  return this->SourceFiles.back().get();
}